

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O3

PointAttribute * __thiscall draco::PointCloud::GetNamedAttribute(PointCloud *this,Type type,int i)

{
  long lVar1;
  int iVar2;
  
  iVar2 = 0;
  if (type < NAMED_ATTRIBUTES_COUNT && type != INVALID) {
    iVar2 = (int)((ulong)((long)this->named_attribute_index_[type].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)this->named_attribute_index_[type].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  }
  if ((i < iVar2) &&
     (lVar1 = (long)this->named_attribute_index_[type].super__Vector_base<int,_std::allocator<int>_>
                    ._M_impl.super__Vector_impl_data._M_start[i], lVar1 != -1)) {
    return (PointAttribute *)
           ((_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar1]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t).
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
    ;
  }
  return (PointAttribute *)0x0;
}

Assistant:

int32_t PointCloud::NumNamedAttributes(GeometryAttribute::Type type) const {
  if (type == GeometryAttribute::INVALID ||
      type >= GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
    return 0;
  }
  return static_cast<int32_t>(named_attribute_index_[type].size());
}